

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void * arena_ralloc(tsdn_t *tsdn,arena_t *arena,void *ptr,size_t oldsize,size_t size,
                   size_t alignment,_Bool zero,tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  cache_bin_stats_t *pcVar1;
  rtree_ctx_cache_elm_t *prVar2;
  int iVar3;
  void *pvVar4;
  rtree_leaf_elm_t *prVar5;
  long lVar6;
  cache_bin_info_t *pcVar7;
  _Bool _Var8;
  uint uVar9;
  szind_t sVar10;
  void *pvVar11;
  ulong uVar12;
  arena_t *paVar13;
  void *pvVar14;
  rtree_leaf_elm_t *prVar15;
  ulong uVar16;
  size_t sVar17;
  cache_bin_t *tbin;
  rtree_ctx_t *ctx;
  int iVar18;
  rtree_ctx_cache_elm_t *prVar19;
  rtree_ctx_cache_elm_t *prVar20;
  size_t size_00;
  bool bVar21;
  size_t newsize;
  
  if (size < 0x1001) {
    size_00 = sz_index2size_tab[sz_size2index_tab[size + 7 >> 3]];
  }
  else if (size < 0x7000000000000001) {
    uVar12 = size * 2 - 1;
    lVar6 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    uVar12 = ~(-1L << ((char)lVar6 - 3U & 0x3f));
    if ((uint)lVar6 < 7) {
      uVar12 = 0xf;
    }
    size_00 = ~uVar12 & size + uVar12;
  }
  else {
    size_00 = 0;
  }
  if (0x7000000000000000 < size) {
    return (void *)0x0;
  }
  if (size_00 == 0) {
    return (void *)0x0;
  }
  if ((size_00 < 0x3801) &&
     (_Var8 = arena_ralloc_no_move(tsdn,ptr,oldsize,size_00,0,zero,&newsize), !_Var8)) {
    hook_invoke_expand(hook_args->is_realloc ^ hook_expand_rallocx,ptr,oldsize,size_00,
                       (uintptr_t)ptr,hook_args->args);
    return ptr;
  }
  if ((0x3fff < oldsize) && (0x3fff < size_00)) {
    pvVar11 = large_ralloc(tsdn,arena,ptr,size_00,alignment,zero,tcache,hook_args);
    return pvVar11;
  }
  if (alignment == 0) {
    if (size_00 < 0x1001) {
      uVar12 = (ulong)sz_size2index_tab[size_00 + 7 >> 3];
    }
    else {
      sVar10 = sz_size2index_compute(size_00);
      uVar12 = (ulong)sVar10;
    }
    if (tcache == (tcache_t *)0x0) {
LAB_0010f709:
      pvVar11 = arena_malloc_hard(tsdn,arena,size_00,(szind_t)uVar12,zero);
      goto LAB_0010f3df;
    }
    if (size_00 < 0x3801) {
      tbin = tcache->bins_small + uVar12;
      iVar3 = tcache->bins_small[uVar12].ncached;
      iVar18 = iVar3 + -1;
      tcache->bins_small[uVar12].ncached = iVar18;
      if ((tbin->low_water < iVar18) || (tbin->low_water = iVar18, iVar3 != 0)) {
        pvVar11 = tcache->bins_small[uVar12].avail[-iVar3];
        bVar21 = true;
      }
      else {
        tcache->bins_small[uVar12].ncached = 0;
        bVar21 = false;
        pvVar11 = (void *)0x0;
      }
      if (bVar21) {
LAB_0010f31f:
        sVar17 = sz_index2size_tab[uVar12];
        if (zero) {
LAB_0010f536:
          iVar18 = 0;
LAB_0010f7a8:
          memset(pvVar11,iVar18,sVar17);
        }
        else {
          if (opt_junk_alloc == true) {
            sVar17 = bin_infos[uVar12].reg_size;
            iVar18 = 0xa5;
            goto LAB_0010f7a8;
          }
          if (opt_zero == true) goto LAB_0010f536;
        }
        pcVar1 = &tcache->bins_small[uVar12].tstats;
        pcVar1->nrequests = pcVar1->nrequests + 1;
        iVar18 = (tcache->gc_ticker).tick;
        (tcache->gc_ticker).tick = iVar18 + -1;
        if (iVar18 < 1) goto LAB_0010f370;
        goto LAB_0010f3df;
      }
      paVar13 = arena_choose(&tsdn->tsd,arena);
      if (paVar13 == (arena_t *)0x0) {
        newsize._0_1_ = '\0';
      }
      else {
        pvVar11 = tcache_alloc_small_hard
                            (tsdn,paVar13,tcache,tbin,(szind_t)uVar12,(_Bool *)&newsize);
      }
      if ((char)newsize != '\0') goto LAB_0010f31f;
      goto LAB_0010f78a;
    }
    if (tcache_maxclass < size_00) goto LAB_0010f709;
    iVar3 = tcache->bins_small[uVar12 + 5].ncached;
    iVar18 = iVar3 + -1;
    tcache->bins_small[uVar12 + 5].ncached = iVar18;
    if ((tcache->bins_small[uVar12 + 5].low_water < iVar18) ||
       (tcache->bins_small[uVar12 + 5].low_water = iVar18, iVar3 != 0)) {
      pvVar11 = tcache->bins_small[uVar12 + 5].avail[-iVar3];
      bVar21 = true;
    }
    else {
      tcache->bins_small[uVar12 + 5].ncached = 0;
      bVar21 = false;
      pvVar11 = (void *)0x0;
    }
    if (bVar21) {
      if (zero) {
LAB_0010f87e:
        iVar18 = 0;
LAB_0010f91e:
        memset(pvVar11,iVar18,sz_index2size_tab[uVar12]);
      }
      else {
        if (opt_junk_alloc == true) {
          iVar18 = 0xa5;
          goto LAB_0010f91e;
        }
        if (opt_zero == true) goto LAB_0010f87e;
      }
      pcVar1 = &tcache->bins_small[uVar12 + 5].tstats;
      pcVar1->nrequests = pcVar1->nrequests + 1;
LAB_0010f6e3:
      iVar18 = (tcache->gc_ticker).tick;
      (tcache->gc_ticker).tick = iVar18 + -1;
      if (0 < iVar18) goto LAB_0010f3df;
LAB_0010f370:
      (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
      tcache_event_hard(&tsdn->tsd,tcache);
    }
    else {
      paVar13 = arena_choose(&tsdn->tsd,arena);
      if (paVar13 != (arena_t *)0x0) {
        if (size_00 < 0x1001) {
          sVar17 = sz_index2size_tab[sz_size2index_tab[size_00 + 7 >> 3]];
        }
        else if (size_00 < 0x7000000000000001) {
          uVar12 = size_00 * 2 - 1;
          lVar6 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar6 == 0; lVar6 = lVar6 + -1) {
            }
          }
          uVar12 = ~(-1L << ((char)lVar6 - 3U & 0x3f));
          if ((uint)lVar6 < 7) {
            uVar12 = 0xf;
          }
          sVar17 = ~uVar12 & uVar12 + size_00;
        }
        else {
          sVar17 = 0;
        }
        pvVar11 = large_malloc(tsdn,paVar13,sVar17,zero);
        if (pvVar11 != (void *)0x0) goto LAB_0010f6e3;
      }
      pvVar11 = (void *)0x0;
    }
  }
  else {
    if ((alignment < 0x1000) && (size_00 < 0x3801)) {
      uVar12 = -alignment & (alignment + size_00) - 1;
      if (uVar12 < 0x1001) {
        sVar17 = sz_index2size_tab[sz_size2index_tab[uVar12 + 7 >> 3]];
      }
      else if (uVar12 < 0x7000000000000001) {
        uVar16 = uVar12 * 2 - 1;
        lVar6 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        uVar16 = ~(-1L << ((char)lVar6 - 3U & 0x3f));
        if ((uint)lVar6 < 7) {
          uVar16 = 0xf;
        }
        sVar17 = ~uVar16 & uVar12 + uVar16;
      }
      else {
        sVar17 = 0;
      }
      if (0x3fff < sVar17) goto LAB_0010f23d;
    }
    else {
LAB_0010f23d:
      if (alignment < 0x7000000000000001) {
        uVar12 = 0x4000;
        if (0x4000 < size_00) {
          if (size_00 < 0x7000000000000001) {
            uVar12 = size_00 * 2 - 1;
            lVar6 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar6 == 0; lVar6 = lVar6 + -1) {
              }
            }
            uVar12 = ~(-1L << ((char)lVar6 - 3U & 0x3f));
            if ((uint)lVar6 < 7) {
              uVar12 = 0xf;
            }
            uVar12 = ~uVar12 & uVar12 + size_00;
          }
          else {
            uVar12 = 0;
          }
          if (uVar12 < size_00) goto LAB_0010f2ab;
        }
        sVar17 = 0;
        if (uVar12 <= (0x7ffffffffffff000 - alignment | 0x8000000000000fff)) {
          sVar17 = uVar12;
        }
      }
      else {
LAB_0010f2ab:
        sVar17 = 0;
      }
    }
    if (sVar17 + 0x8fffffffffffffff < 0x9000000000000000) {
LAB_0010f78a:
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = arena_palloc(tsdn,arena,sVar17,alignment,zero,tcache);
    }
  }
LAB_0010f3df:
  if (pvVar11 == (void *)0x0) {
    return (void *)0x0;
  }
  hook_invoke_alloc(hook_alloc_rallocx - hook_args->is_realloc,pvVar11,(uintptr_t)pvVar11,
                    hook_args->args);
  hook_invoke_dalloc(hook_dalloc_rallocx - hook_args->is_realloc,ptr,hook_args->args);
  if (oldsize <= size_00) {
    size_00 = oldsize;
  }
  memcpy(pvVar11,ptr,size_00);
  if (tcache == (tcache_t *)0x0) {
    arena_sdalloc_no_tcache(tsdn,ptr,oldsize);
    return pvVar11;
  }
  if (oldsize < 0x1001) {
    sVar10 = (szind_t)sz_size2index_tab[oldsize + 7 >> 3];
  }
  else {
    sVar10 = sz_size2index_compute(oldsize);
  }
  if (0x23 < sVar10) {
    if (nhbins <= sVar10) {
      if (tsdn == (tsdn_t *)0x0) {
        ctx = (rtree_ctx_t *)&newsize;
        rtree_ctx_data_init(ctx);
      }
      else {
        ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      pvVar14 = (void *)((ulong)ptr & 0xffffffffc0000000);
      uVar12 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
      prVar15 = (rtree_leaf_elm_t *)((long)&ctx->cache[0].leafkey + uVar12);
      pvVar4 = *(void **)((long)&ctx->cache[0].leafkey + uVar12);
      if (pvVar4 == pvVar14) {
        prVar15 = (rtree_leaf_elm_t *)
                  ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + (long)prVar15[1].le_bits.repr);
      }
      else if ((void *)ctx->l2_cache[0].leafkey == pvVar14) {
        prVar5 = ctx->l2_cache[0].leaf;
        ctx->l2_cache[0].leafkey = (uintptr_t)pvVar4;
        ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar15[1].le_bits.repr;
        (prVar15->le_bits).repr = pvVar14;
        prVar15[1].le_bits.repr = prVar5;
        prVar15 = (rtree_leaf_elm_t *)
                  ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
      }
      else {
        prVar19 = ctx->l2_cache + 1;
        if ((void *)ctx->l2_cache[1].leafkey == pvVar14) {
          uVar16 = 0;
          bVar21 = false;
        }
        else {
          uVar12 = 1;
          prVar20 = prVar19;
          do {
            uVar16 = uVar12;
            bVar21 = 6 < uVar16;
            if (uVar16 == 7) goto LAB_0010fa57;
            prVar19 = prVar20 + 1;
            prVar2 = prVar20 + 1;
            uVar12 = uVar16 + 1;
            prVar20 = prVar19;
          } while ((void *)prVar2->leafkey != pvVar14);
          bVar21 = 6 < uVar16;
        }
        prVar5 = prVar19->leaf;
        prVar19->leafkey = ctx->l2_cache[uVar16].leafkey;
        prVar19->leaf = ctx->l2_cache[uVar16].leaf;
        ctx->l2_cache[uVar16].leafkey = (uintptr_t)pvVar4;
        ctx->l2_cache[uVar16].leaf = (rtree_leaf_elm_t *)prVar15[1].le_bits.repr;
        (prVar15->le_bits).repr = pvVar14;
        prVar15[1].le_bits.repr = prVar5;
        prVar15 = (rtree_leaf_elm_t *)
                  ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_0010fa57:
        if (bVar21) {
          prVar15 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,ctx,(uintptr_t)ptr,true,false);
        }
      }
      large_dalloc(tsdn,(extent_t *)
                        (((long)(prVar15->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe));
      return pvVar11;
    }
    if (opt_junk_free == true) {
      large_dalloc_junk_impl(ptr,sz_index2size_tab[sVar10]);
    }
    if (tcache->bins_small[(ulong)sVar10 + 5].ncached == tcache_bin_info[sVar10].ncached_max) {
      tcache_bin_flush_large
                (&tsdn->tsd,tcache->bins_small + (ulong)sVar10 + 5,sVar10,
                 tcache_bin_info[sVar10].ncached_max >> 1,tcache);
    }
    iVar18 = tcache->bins_small[(ulong)sVar10 + 5].ncached;
    tcache->bins_small[(ulong)sVar10 + 5].ncached = iVar18 + 1;
    tcache->bins_small[(ulong)sVar10 + 5].avail[~(long)iVar18] = ptr;
    iVar18 = (tcache->gc_ticker).tick;
    (tcache->gc_ticker).tick = iVar18 + -1;
    if (0 < iVar18) {
      return pvVar11;
    }
    (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
    goto LAB_0010f4e2;
  }
  if (opt_junk_free == true) {
    memset(ptr,0x5a,bin_infos[sVar10].reg_size);
  }
  pcVar7 = tcache_bin_info;
  uVar9 = tcache->bins_small[sVar10].ncached;
  if (uVar9 == tcache_bin_info[sVar10].ncached_max) {
    tcache_bin_flush_small
              (&tsdn->tsd,tcache,tcache->bins_small + sVar10,sVar10,
               tcache_bin_info[sVar10].ncached_max >> 1);
    uVar9 = tcache->bins_small[sVar10].ncached;
    if (uVar9 != pcVar7[sVar10].ncached_max) goto LAB_0010f4ab;
  }
  else {
LAB_0010f4ab:
    tcache->bins_small[sVar10].ncached = uVar9 + 1;
    tcache->bins_small[sVar10].avail[(int)~uVar9] = ptr;
  }
  iVar18 = (tcache->gc_ticker).tick;
  (tcache->gc_ticker).tick = iVar18 + -1;
  if (0 < iVar18) {
    return pvVar11;
  }
  (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
LAB_0010f4e2:
  tcache_event_hard(&tsdn->tsd,tcache);
  return pvVar11;
}

Assistant:

void *
arena_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t oldsize,
    size_t size, size_t alignment, bool zero, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	size_t usize = sz_s2u(size);
	if (unlikely(usize == 0 || size > SC_LARGE_MAXCLASS)) {
		return NULL;
	}

	if (likely(usize <= SC_SMALL_MAXCLASS)) {
		/* Try to avoid moving the allocation. */
		UNUSED size_t newsize;
		if (!arena_ralloc_no_move(tsdn, ptr, oldsize, usize, 0, zero,
		    &newsize)) {
			hook_invoke_expand(hook_args->is_realloc
			    ? hook_expand_realloc : hook_expand_rallocx,
			    ptr, oldsize, usize, (uintptr_t)ptr,
			    hook_args->args);
			return ptr;
		}
	}

	if (oldsize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS) {
		return large_ralloc(tsdn, arena, ptr, usize,
		    alignment, zero, tcache, hook_args);
	}

	/*
	 * size and oldsize are different enough that we need to move the
	 * object.  In that case, fall back to allocating new space and copying.
	 */
	void *ret = arena_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero, tcache);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	/*
	 * Junk/zero-filling were already done by
	 * ipalloc()/arena_malloc().
	 */
	size_t copysize = (usize < oldsize) ? usize : oldsize;
	memcpy(ret, ptr, copysize);
	isdalloct(tsdn, ptr, oldsize, tcache, NULL, true);
	return ret;
}